

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

U64 XXH_swap64(U64 x)

{
  U64 x_local;
  
  return x << 0x38 | (x & 0xff00) << 0x28 | (x & 0xff0000) << 0x18 | (x & 0xff000000) << 8 |
         x >> 8 & 0xff000000 | x >> 0x18 & 0xff0000 | x >> 0x28 & 0xff00 | x >> 0x38;
}

Assistant:

static U64 XXH_swap64 (U64 x)
{
    return  ((x << 56) & 0xff00000000000000ULL) |
            ((x << 40) & 0x00ff000000000000ULL) |
            ((x << 24) & 0x0000ff0000000000ULL) |
            ((x << 8)  & 0x000000ff00000000ULL) |
            ((x >> 8)  & 0x00000000ff000000ULL) |
            ((x >> 24) & 0x0000000000ff0000ULL) |
            ((x >> 40) & 0x000000000000ff00ULL) |
            ((x >> 56) & 0x00000000000000ffULL);
}